

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Type __thiscall wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  uint32_t uVar2;
  BasicHeapType BVar3;
  Exactness EVar4;
  Type *pTVar5;
  HeapType HVar6;
  uintptr_t *puVar7;
  uint uVar8;
  Nullability nullable;
  size_t *psVar9;
  Type local_68;
  Type subType;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  Iterator __begin2;
  Type type_local;
  
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = type.id;
  if ((type.id & 1) == 0 || type.id < 7) {
    if ((type.id & 1) == 0 && 6 < type.id) {
      types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)Type::getHeapType((Type *)&__begin2.
                                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                               .index);
      if ((this->funcContext != (FunctionCreationContext *)0x0) ||
         (subType.id = __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index,
         ((uint)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage & 0x7b) != 0x48 ||
         0x7c < types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage)) {
        bVar1 = Type::isExact((Type *)&__begin2.
                                       super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .index);
        if (bVar1) {
          if ((((pointer)0x7c <
                types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) ||
              (uVar8 = (uint)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage & 0x7b,
              4 < (uVar8 << 0x1d | uVar8 - 8 >> 3) - 10)) &&
             (uVar2 = Random::upTo(&this->random,0x14), uVar2 == 0)) {
            BVar3 = HeapType::getBottom((HeapType *)
                                        &types.
                                         super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)BVar3;
          }
        }
        else {
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)getSubType(this,(HeapType)
                                        types.
                                        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        nullable = NonNullable;
        if ((((uint)__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index & 3) == 2 &&
             6 < __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index)
           && ((((this->wasm->features).features & 0x400) == 0 ||
               (uVar2 = Random::upTo(&this->random,2), nullable = NonNullable, uVar2 != 0)))) {
          nullable = Nullable;
        }
        psVar9 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
        ;
        EVar4 = Type::getExactness((Type *)psVar9);
        Type::Type(&local_68,
                   (HeapType)
                   types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,nullable,(uint)(EVar4 == Exact));
        auStack_58 = (undefined1  [8])local_68.id;
        if (((((local_68.id & 3) != 0 || local_68.id < 7) ||
             (HVar6 = Type::getHeapType((Type *)auStack_58), 0x7c < HVar6.id)) ||
            ((uVar8 = (uint)HVar6.id & 0x7b, 4 < (uVar8 << 0x1d | uVar8 - 8 >> 3) - 10 ||
             (((auStack_58 = (undefined1  [8])
                             __begin2.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             index,
               (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index &
               3) == 0 &&
               6 < __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index && (HVar6 = Type::getHeapType((Type *)auStack_58), HVar6.id < 0x7d)) &&
              (uVar8 = (uint)HVar6.id & 0x7b, (uVar8 << 0x1d | uVar8 - 8 >> 3) - 10 < 5)))))) ||
           (uVar2 = Random::upTo(&this->random,0x14), uVar2 == 0)) {
          psVar9 = &local_68.id;
        }
        subType.id = *psVar9;
      }
    }
    else {
      subType.id = type.id;
      if (6 < type.id) {
        __assert_fail("type.isBasic()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x15b9,"Type wasm::TranslateToFuzzReader::getSubType(Type)");
      }
    }
  }
  else {
    auStack_58 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar9 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)psVar9;
    pTVar5 = (Type *)Type::size((Type *)psVar9);
    if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
        pTVar5) goto LAB_001457e9;
    do {
      do {
        puVar7 = (uintptr_t *)
                 ::wasm::Type::Iterator::operator*
                           ((Iterator *)
                            &types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_68 = getSubType(this,*puVar7);
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_68);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = (uintptr_t)local_68;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
               != pTVar5);
LAB_001457e9:
    } while (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != (pointer)psVar9);
    ::wasm::Type::Type(&subType,auStack_58);
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
  }
  return (Type)subType.id;
}

Assistant:

Type TranslateToFuzzReader::getSubType(Type type) {
  if (type.isTuple()) {
    std::vector<Type> types;
    for (const auto& t : type) {
      types.push_back(getSubType(t));
    }
    return Type(types);
  } else if (type.isRef()) {
    auto heapType = type.getHeapType();
    // Do not generate non-nullable exnrefs in global positions (they cannot be
    // created in wasm, nor imported from JS).
    if (!funcContext && heapType.isMaybeShared(HeapType::exn)) {
      return type;
    }
    if (type.isExact()) {
      // The only other possible heap type is bottom, but we don't want to
      // generate too many bottom types.
      if (!heapType.isBottom() && oneIn(20)) {
        heapType = heapType.getBottom();
      }
    } else {
      heapType = getSubType(heapType);
    }
    auto nullability = getSubType(type.getNullability());
    auto exactness = getSubType(type.getExactness());
    auto subType = Type(heapType, nullability, exactness);
    // We don't want to emit lots of uninhabitable types like (ref none), so
    // avoid them with high probability. Specifically, if the original type was
    // inhabitable then return that; avoid adding more uninhabitability.
    if (GCTypeUtils::isUninhabitable(subType) &&
        !GCTypeUtils::isUninhabitable(type) && !oneIn(20)) {
      return type;
    }
    return subType;
  } else {
    // This is an MVP type without subtypes.
    assert(type.isBasic());
    return type;
  }
}